

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

size_t __thiscall Memory::Recycler::TryMarkBigBlockList(Recycler *this,BigBlock *memoryBlocks)

{
  size_t scanRootBytes;
  size_t sVar1;
  
  sVar1 = 0;
  for (; memoryBlocks != (BigBlock *)0x0;
      memoryBlocks = (memoryBlocks->super_ArenaMemoryBlock).field_0.nextBigBlock) {
    sVar1 = sVar1 + memoryBlocks->currentByte;
    ScanMemory<false>(this,(void **)(memoryBlocks + 1),memoryBlocks->currentByte);
  }
  return sVar1;
}

Assistant:

size_t
Recycler::TryMarkBigBlockList(BigBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    BigBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base = (void**)blockp->GetBytes();
        size_t byteCount = blockp->currentByte;
        scanRootBytes +=  byteCount;
        this->ScanMemory<false>(base, byteCount);
        blockp = blockp->nextBigBlock;
    }
    return scanRootBytes;
}